

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_key_exchange(ptls_key_exchange_algorithm_t *client,ptls_key_exchange_algorithm_t *server)

{
  ptls_iovec_t pVar1;
  int iVar2;
  ptls_iovec_t server_secret;
  ptls_iovec_t server_pubkey;
  ptls_key_exchange_context_t *ctx;
  ptls_iovec_t client_secret;
  ptls_iovec_t local_68;
  ptls_iovec_t local_58;
  st_ptls_key_exchange_context_t *local_48;
  ptls_iovec_t local_40;
  
  iVar2 = (*server->exchange)(server,&local_58,&local_68,(ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x640);
  iVar2 = (*client->create)(client,&local_48);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x644);
  iVar2 = (*server->exchange)(server,&local_58,&local_68,local_48->pubkey);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x646);
  pVar1.len = local_58.len;
  pVar1.base = local_58.base;
  iVar2 = (*local_48->on_exchange)(&local_48,1,&local_40,pVar1);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x648);
  _ok((uint)(local_40.len == local_68.len),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x649);
  iVar2 = bcmp(local_40.base,local_68.base,local_40.len);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x64a);
  free(local_40.base);
  free(local_58.base);
  free(local_68.base);
  iVar2 = (*client->create)(client,&local_48);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  iVar2 = (*local_48->on_exchange)(&local_48,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x654);
  _ok((uint)(local_48 == (st_ptls_key_exchange_context_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x655);
  return;
}

Assistant:

void test_key_exchange(ptls_key_exchange_algorithm_t *client, ptls_key_exchange_algorithm_t *server)
{
    ptls_key_exchange_context_t *ctx;
    ptls_iovec_t client_secret, server_pubkey, server_secret;
    int ret;

    /* fail */
    ret = server->exchange(server, &server_pubkey, &server_secret, (ptls_iovec_t){NULL});
    ok(ret != 0);

    /* perform ecdh */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = server->exchange(server, &server_pubkey, &server_secret, ctx->pubkey);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, &client_secret, server_pubkey);
    ok(ret == 0);
    ok(client_secret.len == server_secret.len);
    ok(memcmp(client_secret.base, server_secret.base, client_secret.len) == 0);

    free(client_secret.base);
    free(server_pubkey.base);
    free(server_secret.base);

    /* client abort */
    ret = client->create(client, &ctx);
    ok(ret == 0);
    ret = ctx->on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    ok(ret == 0);
    ok(ctx == NULL);
}